

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncEvent.cpp
# Opt level: O0

Attribute anon_unknown.dwarf_2e8b98::get_async_event_begin_attr(Caliper *c)

{
  __pointer_type pNVar1;
  Node *__p;
  allocator<char> local_41;
  string local_40 [32];
  __pointer_type local_20;
  __pointer_type node;
  Caliper *c_local;
  Attribute attr;
  
  node = (__pointer_type)c;
  local_20 = cali::CaliperMetadataDB::std::atomic<cali::Node_*>::load
                       ((atomic<cali::Node_*> *)&get_async_event_begin_attr::s_attr_node,
                        memory_order_seq_cst);
  pNVar1 = node;
  if (local_20 == (__pointer_type)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_40,"async.begin",&local_41);
    c_local = (Caliper *)
              (*(code *)(((pNVar1->super_LockfreeIntrusiveTree<cali::Node>).m_me)->m_treenode).next)
                        (pNVar1,local_40,4,0x54,0,0,0);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
    __p = cali::Attribute::node((Attribute *)&c_local);
    std::atomic<cali::Node_*>::store
              (&get_async_event_begin_attr::s_attr_node,__p,memory_order_seq_cst);
  }
  else {
    c_local = (Caliper *)cali::Attribute::make_attribute(local_20);
  }
  return (Attribute)(Node *)c_local;
}

Assistant:

Attribute get_async_event_begin_attr(Caliper& c)
{
    static std::atomic<Node*> s_attr_node { nullptr };

    auto node = s_attr_node.load();
    if (node)
        return Attribute::make_attribute(node);

    Attribute attr = c.create_attribute("async.begin", CALI_TYPE_STRING, CALI_ATTR_SCOPE_THREAD | CALI_ATTR_SKIP_EVENTS);
    s_attr_node.store(attr.node());

    return attr;
}